

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementInstancer.cpp
# Opt level: O1

void Rml::Detail::ShutdownElementInstancerPools(void)

{
  code *pcVar1;
  bool bVar2;
  
  if (element_instancer_pools._8_8_ == 0) {
    bVar2 = Assert("Resource used before it was initialized, or after it was shut down.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                   ,0x46);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  if (*(int *)(element_instancer_pools._8_8_ + 0x48) == 0 &&
      *(int *)(element_instancer_pools._8_8_ + 0x20) == 0) {
    ControlledLifetimeResource<Rml::ElementInstancerPools>::Shutdown
              ((ControlledLifetimeResource<Rml::ElementInstancerPools> *)element_instancer_pools);
    return;
  }
  element_instancer_pools[0] = 1;
  return;
}

Assistant:

void Detail::ShutdownElementInstancerPools()
{
	if (element_instancer_pools->IsEmpty())
		element_instancer_pools.Shutdown();
	else
		element_instancer_pools.Leak();
}